

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeFunction<false,true,false,false>
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  int iVar3;
  JavascriptFunction *obj;
  ScriptFunction *this;
  FunctionProxy *this_00;
  ParseableFunctionInfo *pPVar4;
  JavascriptString *local_30;
  JavascriptString *functionName;
  
  obj = VarTo<Js::JavascriptFunction,Js::DynamicObject>(instance);
  pJVar1 = (((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  bVar2 = VarIsImpl<Js::ScriptFunction>((RecyclableObject *)obj);
  if (bVar2) {
    this = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    iVar3 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x77])(this);
    if ((char)iVar3 == '\0') goto LAB_00b06d54;
    DeferredTypeHandlerBase::ConvertFunction
              (typeHandler,obj,(pJVar1->anonymousFunctionTypeHandler).ptr);
    bVar2 = true;
  }
  else {
    this = (ScriptFunction *)0x0;
LAB_00b06d54:
    DeferredTypeHandlerBase::ConvertFunction(typeHandler,obj,(pJVar1->functionTypeHandler).ptr);
    if (this == (ScriptFunction *)0x0) goto LAB_00b06d8a;
    bVar2 = false;
  }
  this_00 = ScriptFunction::GetFunctionProxy(this);
  pPVar4 = FunctionProxy::EnsureDeserialized(this_00);
  if (bVar2) {
    return true;
  }
  if (((pPVar4->super_FunctionProxy).field_0x45 & 0x10) != 0) {
    return true;
  }
LAB_00b06d8a:
  local_30 = (JavascriptString *)0x0;
  bVar2 = JavascriptFunction::GetFunctionName(obj,&local_30);
  if (bVar2) {
    (*(obj->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])(obj,0x106,local_30,2,0,0,0xf)
    ;
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptFunction * function = VarTo<JavascriptFunction>(instance);
        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        ScriptFunction *scriptFunction = nullptr;
        bool useAnonymous = false;
        if (VarIs<ScriptFunction>(function))
        {
            scriptFunction = Js::VarTo<Js::ScriptFunction>(function);
            useAnonymous = scriptFunction->IsAnonymousFunction();
        }

        if (!addPrototype)
        {
            if (!useAnonymous && addName)
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionTypeHandlerWithLength : javascriptLibrary->functionTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionTypeHandler);
            }
        }
        else
        {
            if (useAnonymous)
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionWithPrototypeAndLengthTypeHandler : javascriptLibrary->functionWithPrototypeTypeHandler);
            }
            DynamicObject *protoObject = javascriptLibrary->CreateConstructorPrototypeObject(function);
            if (scriptFunction && scriptFunction->GetFunctionInfo()->IsClassConstructor())
            {
                function->SetPropertyWithAttributes(PropertyIds::prototype, protoObject, PropertyNone, nullptr);
            }
            else
            {
                function->SetProperty(PropertyIds::prototype, protoObject, PropertyOperation_None, nullptr);
            }
        }

        if (scriptFunction)
        {
            ParseableFunctionInfo * funcInfo = scriptFunction->GetFunctionProxy()->EnsureDeserialized();

            CompileAssert(!addLength || useLengthType);
            if (addLength)
            {
                function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(funcInfo->GetReportedInParamsCount() - 1), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
            }

            if (useAnonymous || funcInfo->GetIsStaticNameFunction())
            {
                return true;
            }
        }

        if (addName)
        {
            JavascriptString * functionName = nullptr;
            if (((Js::JavascriptFunction*)function)->GetFunctionName(&functionName))
            {
                function->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
        }

        return true;
    }